

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SegReaderCursorAppend(Fts3MultiSegReader *pCsr,Fts3SegReader *pNew)

{
  int iVar1;
  int iVar2;
  Fts3SegReader **ppFVar3;
  
  iVar1 = pCsr->nSegment;
  if (((long)iVar1 & 0xfU) == 0) {
    ppFVar3 = pCsr->apSegment;
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      ppFVar3 = (Fts3SegReader **)sqlite3Realloc(ppFVar3,(long)iVar1 * 8 + 0x80);
    }
    else {
      ppFVar3 = (Fts3SegReader **)0x0;
    }
    if (ppFVar3 == (Fts3SegReader **)0x0) {
      sqlite3Fts3SegReaderFree(pNew);
      return 7;
    }
    pCsr->apSegment = ppFVar3;
  }
  iVar1 = pCsr->nSegment;
  pCsr->nSegment = iVar1 + 1;
  pCsr->apSegment[iVar1] = pNew;
  return 0;
}

Assistant:

static int fts3SegReaderCursorAppend(
  Fts3MultiSegReader *pCsr,
  Fts3SegReader *pNew
){
  if( (pCsr->nSegment%16)==0 ){
    Fts3SegReader **apNew;
    sqlite3_int64 nByte = (pCsr->nSegment + 16)*sizeof(Fts3SegReader*);
    apNew = (Fts3SegReader **)sqlite3_realloc64(pCsr->apSegment, nByte);
    if( !apNew ){
      sqlite3Fts3SegReaderFree(pNew);
      return SQLITE_NOMEM;
    }
    pCsr->apSegment = apNew;
  }
  pCsr->apSegment[pCsr->nSegment++] = pNew;
  return SQLITE_OK;
}